

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_custom_notification.cxx
# Opt level: O0

ptr<custom_notification_msg> nuraft::custom_notification_msg::deserialize(buffer *buf)

{
  uint8_t uVar1;
  byte bVar2;
  type tVar3;
  element_type *peVar4;
  element_type *this;
  byte *__dest;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  buffer *in_RSI;
  buffer_serializer *in_RDI;
  ptr<custom_notification_msg> pVar6;
  void *ptr;
  size_t buf_len;
  uint8_t version;
  buffer_serializer bs;
  ptr<custom_notification_msg> *ret;
  size_t in_stack_000000a8;
  shared_ptr<nuraft::buffer> *in_stack_ffffffffffffff58;
  shared_ptr<nuraft::buffer> *in_stack_ffffffffffffff60;
  undefined6 in_stack_ffffffffffffff78;
  buffer_serializer *this_00;
  shared_ptr<nuraft::buffer> local_60;
  void *local_50;
  size_t local_48;
  uint8_t local_3d;
  buffer_serializer local_30;
  undefined1 local_11;
  buffer *local_10;
  
  local_11 = 0;
  this_00 = in_RDI;
  local_10 = in_RSI;
  cs_new<nuraft::custom_notification_msg>();
  buffer_serializer::buffer_serializer(&local_30,local_10,LITTLE);
  uVar1 = buffer_serializer::get_u8(this_00);
  local_3d = uVar1;
  bVar2 = buffer_serializer::get_u8(this_00);
  tVar3 = (type)bVar2;
  peVar4 = std::
           __shared_ptr_access<nuraft::custom_notification_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<nuraft::custom_notification_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x46bf24);
  peVar4->type_ = tVar3;
  local_48 = 0;
  local_50 = buffer_serializer::get_bytes
                       (this_00,(size_t *)CONCAT17(uVar1,CONCAT16(bVar2,in_stack_ffffffffffffff78)))
  ;
  if (local_48 == 0) {
    std::shared_ptr<nuraft::buffer>::shared_ptr(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58)
    ;
    std::
    __shared_ptr_access<nuraft::custom_notification_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<nuraft::custom_notification_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x46c005);
    std::shared_ptr<nuraft::buffer>::operator=(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    std::shared_ptr<nuraft::buffer>::~shared_ptr((shared_ptr<nuraft::buffer> *)0x46c020);
    _Var5._M_pi = extraout_RDX_00;
  }
  else {
    nuraft::buffer::alloc(in_stack_000000a8);
    std::
    __shared_ptr_access<nuraft::custom_notification_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<nuraft::custom_notification_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x46bf7a);
    std::shared_ptr<nuraft::buffer>::operator=(in_stack_ffffffffffffff60,&local_60);
    std::shared_ptr<nuraft::buffer>::~shared_ptr((shared_ptr<nuraft::buffer> *)0x46bf98);
    std::
    __shared_ptr_access<nuraft::custom_notification_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<nuraft::custom_notification_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x46bfa2);
    this = std::__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x46bfae);
    __dest = nuraft::buffer::data_begin(this);
    memcpy(__dest,local_50,local_48);
    _Var5._M_pi = extraout_RDX;
  }
  pVar6.super___shared_ptr<nuraft::custom_notification_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var5._M_pi;
  pVar6.super___shared_ptr<nuraft::custom_notification_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)in_RDI;
  return (ptr<custom_notification_msg>)
         pVar6.super___shared_ptr<nuraft::custom_notification_msg,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<custom_notification_msg> custom_notification_msg::deserialize(buffer& buf) {
    ptr<custom_notification_msg> ret = cs_new<custom_notification_msg>();

    buffer_serializer bs(buf);
    uint8_t version = bs.get_u8();
    (void)version;
    ret->type_ = static_cast<custom_notification_msg::type>(bs.get_u8());

    size_t buf_len = 0;
    void* ptr = bs.get_bytes(buf_len);

    if (buf_len) {
        ret->ctx_ = buffer::alloc(buf_len);
        memcpy(ret->ctx_->data_begin(), ptr, buf_len);
    } else {
        ret->ctx_ = nullptr;
    }

    return ret;
}